

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O3

bool crnlib::image_utils::has_alpha(image_u8 *img)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar1 = img->m_height;
  uVar5 = 0;
  if (uVar1 != 0) {
    bVar6 = true;
    uVar4 = 0;
    uVar2 = (ulong)img->m_width;
    uVar3 = uVar5;
    do {
      for (; uVar2 != 0; uVar2 = uVar2 - 1) {
        if (img->m_pPixels[uVar5].field_0.field_0.a != 0xff) {
          return bVar6;
        }
        uVar5 = uVar5 + 1;
      }
      uVar4 = uVar4 + 1;
      uVar5 = uVar3 + img->m_pitch;
      bVar6 = uVar4 < uVar1;
      uVar2 = (ulong)img->m_width;
      uVar3 = uVar5;
    } while (uVar4 != uVar1);
  }
  return false;
}

Assistant:

bool has_alpha(const image_u8& img)
        {
            for (uint y = 0; y < img.get_height(); y++)
            {
                for (uint x = 0; x < img.get_width(); x++)
                {
                    if (img(x, y).a < 255)
                    {
                        return true;
                    }
                }
            }

            return false;
        }